

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::visitSIMDLoadStoreLane(FunctionValidator *this,SIMDLoadStoreLane *curr)

{
  bool bVar1;
  Index bytes_00;
  Module *pMVar2;
  address64_t align;
  Type TStack_b8;
  Index bytes;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type memAlignType;
  size_t lanes;
  Type local_80;
  address64_t local_78;
  undefined8 uStack_70;
  uintptr_t local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  address64_t local_30;
  undefined8 local_28;
  Memory *local_20;
  Memory *memory;
  SIMDLoadStoreLane *curr_local;
  FunctionValidator *this_local;
  
  memory = (Memory *)curr;
  curr_local = (SIMDLoadStoreLane *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  local_30 = (memory->max).addr;
  local_28 = *(undefined8 *)&memory->shared;
  local_20 = Module::getMemoryOrNull(pMVar2,(IString)*(IString *)&memory->max);
  shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this,local_20 != (Memory *)0x0,(SIMDLoadStoreLane *)memory,
             "memory.SIMDLoadStoreLane memory must exist");
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasSIMD(&pMVar2->features);
  shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this,bVar1,(SIMDLoadStoreLane *)memory,"SIMD operations require SIMD [--enable-simd]");
  bVar1 = SIMDLoadStoreLane::isLoad((SIMDLoadStoreLane *)memory);
  if (bVar1) {
    local_38.id = (uintptr_t)(memory->super_Importable).super_Named.name.super_IString.str._M_str;
    wasm::Type::Type(&local_40,v128);
    shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
              (this,local_38,local_40,(SIMDLoadStoreLane *)memory,"loadX_lane must have type v128");
  }
  else {
    local_48.id = (uintptr_t)(memory->super_Importable).super_Named.name.super_IString.str._M_str;
    wasm::Type::Type(&local_50,none);
    shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
              (this,local_48,local_50,(SIMDLoadStoreLane *)memory,"storeX_lane must have type none")
    ;
  }
  local_58.id = *(uintptr_t *)((memory->super_Importable).base.super_IString.str._M_str + 8);
  local_78 = (memory->max).addr;
  uStack_70 = *(undefined8 *)&memory->shared;
  local_60 = (uintptr_t)indexType(this,(IString)*(IString *)&memory->max);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this,local_58,(Type)local_60,(SIMDLoadStoreLane *)memory,
             "loadX_lane or storeX_lane address must match memory index type");
  local_80.id = *(uintptr_t *)((memory->initial).addr + 8);
  wasm::Type::Type((Type *)&lanes,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this,local_80,(Type)lanes,(SIMDLoadStoreLane *)memory,
             "loadX_lane or storeX_lane vector argument must have type v128");
  wasm::Type::Type(&local_98,none);
  switch(*(undefined4 *)&(memory->super_Importable).super_Named.hasExplicitName) {
  case 0:
  case 4:
    memAlignType.id = 0x10;
    wasm::Type::Type(&local_a0,i32);
    local_98.id = local_a0.id;
    break;
  case 1:
  case 5:
    memAlignType.id = 8;
    wasm::Type::Type(&local_a8,i32);
    local_98.id = local_a8.id;
    break;
  case 2:
  case 6:
    memAlignType.id = 4;
    wasm::Type::Type(&local_b0,i32);
    local_98.id = local_b0.id;
    break;
  case 3:
  case 7:
    memAlignType.id = 2;
    wasm::Type::Type(&stack0xffffffffffffff48,i64);
    local_98.id = TStack_b8.id;
    break;
  default:
    handle_unreachable("Unexpected SIMDLoadStoreLane op",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                       ,0x579);
  }
  bytes_00 = SIMDLoadStoreLane::getMemBytes((SIMDLoadStoreLane *)memory);
  align = wasm::Address::operator_cast_to_unsigned_long
                    ((Address *)&(memory->super_Importable).module.super_IString.str._M_str);
  validateAlignment(this,align,local_98,bytes_00,false,(Expression *)memory);
  shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this,(byte)(memory->super_Importable).base.super_IString.str._M_len < memAlignType.id,
             (SIMDLoadStoreLane *)memory,"invalid lane index");
  return;
}

Assistant:

void FunctionValidator::visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.SIMDLoadStoreLane memory must exist");
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  if (curr->isLoad()) {
    shouldBeEqualOrFirstIsUnreachable(
      curr->type, Type(Type::v128), curr, "loadX_lane must have type v128");
  } else {
    shouldBeEqualOrFirstIsUnreachable(
      curr->type, Type(Type::none), curr, "storeX_lane must have type none");
  }
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "loadX_lane or storeX_lane address must match memory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->vec->type,
    Type(Type::v128),
    curr,
    "loadX_lane or storeX_lane vector argument must have type v128");
  size_t lanes;
  Type memAlignType = Type::none;
  switch (curr->op) {
    case Load8LaneVec128:
    case Store8LaneVec128:
      lanes = 16;
      memAlignType = Type::i32;
      break;
    case Load16LaneVec128:
    case Store16LaneVec128:
      lanes = 8;
      memAlignType = Type::i32;
      break;
    case Load32LaneVec128:
    case Store32LaneVec128:
      lanes = 4;
      memAlignType = Type::i32;
      break;
    case Load64LaneVec128:
    case Store64LaneVec128:
      lanes = 2;
      memAlignType = Type::i64;
      break;
    default:
      WASM_UNREACHABLE("Unexpected SIMDLoadStoreLane op");
  }
  Index bytes = curr->getMemBytes();
  validateAlignment(curr->align, memAlignType, bytes, /*isAtomic=*/false, curr);
  shouldBeTrue(curr->index < lanes, curr, "invalid lane index");
}